

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
anon_unknown.dwarf_7230e6::TargetSourcesImpl::ConvertToAbsoluteContent
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,IsInterface isInterfaceContent,CheckCMP0076 checkCmp0076)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  PolicyStatus PVar5;
  size_type sVar6;
  string *psVar7;
  cmMakefile *pcVar8;
  string *__rhs;
  ostream *poVar9;
  PolicyID id;
  pointer in_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  undefined1 local_238 [48];
  string absoluteSrc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absoluteContent;
  string local_1c8;
  ostringstream e;
  
  if ((checkCmp0076 == Yes) &&
     (PVar5 = cmMakefile::GetPolicyStatus
                        ((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false), PVar5 == OLD
     )) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    return __return_storage_ptr__;
  }
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  absoluteContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&absoluteContent,
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(content->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (in_name = (content->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; in_name != pbVar1;
      in_name = in_name + 1) {
    absoluteSrc._M_dataplus._M_p = (pointer)&absoluteSrc.field_2;
    absoluteSrc._M_string_length = 0;
    absoluteSrc.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if ((bVar2) || (sVar6 = cmGeneratorExpression::Find(in_name), sVar6 == 0)) {
LAB_0020c2a7:
      std::__cxx11::string::_M_assign((string *)&absoluteSrc);
    }
    else {
      if (isInterfaceContent == No) {
        psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((this->super_cmTargetPropCommandBase).Makefile);
        pcVar8 = cmTarget::GetMakefile(tgt);
        __rhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
        _Var3 = std::operator==(psVar7,__rhs);
        if (_Var3) goto LAB_0020c2a7;
      }
      psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((this->super_cmTargetPropCommandBase).Makefile);
      _e = psVar7->_M_string_length;
      local_238._0_8_ = (pointer)0x1;
      local_238._8_8_ = local_238 + 0x10;
      local_238[0x10] = '/';
      cmStrCat<std::__cxx11::string>(&local_1c8,(cmAlphaNum *)&e,(cmAlphaNum *)local_238,in_name);
      std::__cxx11::string::operator=((string *)&absoluteSrc,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      bVar4 = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&absoluteContent,&absoluteSrc);
    std::__cxx11::string::~string((string *)&absoluteSrc);
  }
  if (!bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,content);
    goto LAB_0020c4ca;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  __x = &absoluteContent;
  if (checkCmp0076 != Yes) goto switchD_0020c390_caseD_2;
  PVar5 = cmMakefile::GetPolicyStatus((this->super_cmTargetPropCommandBase).Makefile,CMP0076,false);
  switch(PVar5) {
  case OLD:
switchD_0020c390_caseD_0:
    __x = content;
  case NEW:
switchD_0020c390_caseD_2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,__x);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_0020c4ca:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&absoluteContent);
    return __return_storage_ptr__;
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_238,(cmPolicies *)0x4c,id);
    poVar9 = std::operator<<((ostream *)&e,(string *)local_238);
    std::operator<<(poVar9,"\n");
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar8 = (this->super_cmTargetPropCommandBase).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_238,(cmPolicies *)0x4c,id);
    cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_238);
    break;
  default:
    goto switchD_0020c390_default;
  }
  std::__cxx11::string::~string((string *)local_238);
switchD_0020c390_default:
  if (isInterfaceContent == Yes) {
    poVar9 = std::operator<<((ostream *)&e,"An interface source of target \"");
    psVar7 = cmTarget::GetName_abi_cxx11_(tgt);
  }
  else {
    poVar9 = std::operator<<((ostream *)&e,
                             "A private source from a directory other than that of target \"");
    psVar7 = cmTarget::GetName_abi_cxx11_(tgt);
  }
  poVar9 = std::operator<<(poVar9,(string *)psVar7);
  std::operator<<(poVar9,"\" has a relative path.");
  pcVar8 = (this->super_cmTargetPropCommandBase).Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,(string *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  goto switchD_0020c390_caseD_0;
}

Assistant:

std::vector<std::string> TargetSourcesImpl::ConvertToAbsoluteContent(
  cmTarget* tgt, const std::vector<std::string>& content,
  IsInterface isInterfaceContent, CheckCMP0076 checkCmp0076)
{
  // Skip conversion in case old behavior has been explicitly requested
  if (checkCmp0076 == CheckCMP0076::Yes &&
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0076) ==
        cmPolicies::OLD) {
    return content;
  }

  bool changedPath = false;
  std::vector<std::string> absoluteContent;
  absoluteContent.reserve(content.size());
  for (std::string const& src : content) {
    std::string absoluteSrc;
    if (cmSystemTools::FileIsFullPath(src) ||
        cmGeneratorExpression::Find(src) == 0 ||
        (isInterfaceContent == IsInterface::No &&
         (this->Makefile->GetCurrentSourceDirectory() ==
          tgt->GetMakefile()->GetCurrentSourceDirectory()))) {
      absoluteSrc = src;
    } else {
      changedPath = true;
      absoluteSrc =
        cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', src);
    }
    absoluteContent.push_back(absoluteSrc);
  }

  if (!changedPath) {
    return content;
  }

  bool issueMessage = true;
  bool useAbsoluteContent = false;
  std::ostringstream e;
  if (checkCmp0076 == CheckCMP0076::Yes) {
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0076)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0076) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0076));
        break;
      case cmPolicies::NEW: {
        issueMessage = false;
        useAbsoluteContent = true;
        break;
      }
    }
  } else {
    issueMessage = false;
    useAbsoluteContent = true;
  }

  if (issueMessage) {
    if (isInterfaceContent == IsInterface::Yes) {
      e << "An interface source of target \"" << tgt->GetName()
        << "\" has a relative path.";
    } else {
      e << "A private source from a directory other than that of target \""
        << tgt->GetName() << "\" has a relative path.";
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
  }

  return useAbsoluteContent ? absoluteContent : content;
}